

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

string * __thiscall
CppGenerator::genDumpFunction_abi_cxx11_(string *__return_storage_ptr__,CppGenerator *this)

{
  undefined8 *puVar1;
  bool bVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_t sVar5;
  View *pVVar6;
  Attribute *pAVar7;
  ulong *puVar8;
  size_type *psVar9;
  long *plVar10;
  ulong uVar11;
  undefined8 uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  long lVar14;
  char cVar15;
  ushort uVar16;
  byte bVar27;
  byte bVar33;
  ulong uVar19;
  char cVar28;
  byte bVar29;
  char cVar30;
  byte bVar31;
  char cVar32;
  char cVar34;
  byte bVar35;
  undefined1 auVar25 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  string __str_2;
  string fields;
  string __str_1;
  string __str;
  ulong *local_368;
  long local_360;
  ulong local_358;
  long lStack_350;
  ulong *local_348;
  long local_340;
  ulong local_338;
  undefined8 uStack_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8;
  long lStack_2d0;
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8;
  long lStack_2b0;
  ulong *local_2a8;
  long local_2a0;
  ulong local_298;
  long lStack_290;
  long *local_288;
  long local_280;
  long local_278;
  long lStack_270;
  CppGenerator *local_268;
  ulong *local_260;
  long local_258;
  ulong local_250;
  long lStack_248;
  ulong *local_240;
  long local_238;
  ulong local_230;
  long lStack_228;
  long *local_220;
  long local_218;
  long local_210;
  long lStack_208;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0;
  long lStack_1c8;
  ulong *local_1c0;
  long local_1b8;
  ulong local_1b0;
  long lStack_1a8;
  ulong *local_1a0;
  long local_198;
  ulong local_190;
  long lStack_188;
  undefined8 *local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  long lStack_148;
  ulong *local_140;
  long local_138;
  ulong local_130;
  long lStack_128;
  ulong *local_120;
  long local_118;
  ulong local_110 [2];
  ulong *local_100;
  long local_f8;
  ulong local_f0 [2];
  ulong *local_e0;
  long local_d8;
  ulong local_d0 [2];
  ulong *local_c0;
  long local_b8;
  ulong local_b0 [2];
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  ulong local_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  undefined4 uVar17;
  undefined6 uVar18;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  
  local_2a8 = &local_298;
  local_268 = this;
  std::__cxx11::string::_M_construct((ulong)&local_2a8,'\x03');
  puVar3 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,0x2af89e);
  local_2c8 = &local_2b8;
  puVar8 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar8) {
    local_2b8 = *puVar8;
    lStack_2b0 = puVar3[3];
  }
  else {
    local_2b8 = *puVar8;
    local_2c8 = (ulong *)*puVar3;
  }
  local_2c0 = puVar3[1];
  *puVar3 = puVar8;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  local_368 = &local_358;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_358 = *puVar8;
    lStack_350 = plVar4[3];
  }
  else {
    local_358 = *puVar8;
    local_368 = (ulong *)*plVar4;
  }
  local_360 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_2e8 = &local_2d8;
  std::__cxx11::string::_M_construct((ulong)&local_2e8,'\x03');
  uVar19 = 0xf;
  if (local_368 != &local_358) {
    uVar19 = local_358;
  }
  if (uVar19 < (ulong)(local_2e0 + local_360)) {
    uVar19 = 0xf;
    if (local_2e8 != &local_2d8) {
      uVar19 = local_2d8;
    }
    if (uVar19 < (ulong)(local_2e0 + local_360)) goto LAB_0022b575;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,(ulong)local_368);
  }
  else {
LAB_0022b575:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_368,(ulong)local_2e8);
  }
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  psVar9 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_328.field_2._M_allocated_capacity = *psVar9;
    local_328.field_2._8_8_ = puVar3[3];
  }
  else {
    local_328.field_2._M_allocated_capacity = *psVar9;
    local_328._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_328._M_string_length = puVar3[1];
  *puVar3 = psVar9;
  puVar3[1] = 0;
  *(undefined1 *)psVar9 = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_328);
  puVar8 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar8) {
    local_338 = *puVar8;
    uStack_330 = puVar3[3];
    local_348 = &local_338;
  }
  else {
    local_338 = *puVar8;
    local_348 = (ulong *)*puVar3;
  }
  local_340 = puVar3[1];
  *puVar3 = puVar8;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct((ulong)&local_240,'\x06');
  uVar19 = 0xf;
  if (local_348 != &local_338) {
    uVar19 = local_338;
  }
  if (uVar19 < (ulong)(local_238 + local_340)) {
    uVar19 = 0xf;
    if (local_240 != &local_230) {
      uVar19 = local_230;
    }
    if ((ulong)(local_238 + local_340) <= uVar19) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,(ulong)local_348);
      goto LAB_0022b6d2;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_348,(ulong)local_240);
LAB_0022b6d2:
  local_308 = &local_2f8;
  plVar4 = puVar3 + 2;
  if ((long *)*puVar3 == plVar4) {
    local_2f8 = *plVar4;
    lStack_2f0 = puVar3[3];
  }
  else {
    local_2f8 = *plVar4;
    local_308 = (long *)*puVar3;
  }
  local_300 = puVar3[1];
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_308);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar9 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar9) {
    lVar14 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar14;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_308 != &local_2f8) {
    operator_delete(local_308);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8);
  }
  if (local_368 != &local_358) {
    operator_delete(local_368);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8);
  }
  uVar19 = 0;
  do {
    paVar13 = &local_328.field_2;
    sVar5 = QueryCompiler::numberOfViews
                      ((local_268->_qc).
                       super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (sVar5 <= uVar19) {
      local_328._M_dataplus._M_p = (pointer)paVar13;
      std::__cxx11::string::_M_construct((ulong)&local_328,'\x03');
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_328);
      puVar8 = puVar3 + 2;
      if ((ulong *)*puVar3 == puVar8) {
        local_338 = *puVar8;
        uStack_330 = puVar3[3];
        local_348 = &local_338;
      }
      else {
        local_338 = *puVar8;
        local_348 = (ulong *)*puVar3;
      }
      local_340 = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_348);
      local_308 = &local_2f8;
      plVar10 = plVar4 + 2;
      if ((long *)*plVar4 == plVar10) {
        local_2f8 = *plVar10;
        lStack_2f0 = plVar4[3];
      }
      else {
        local_2f8 = *plVar10;
        local_308 = (long *)*plVar4;
      }
      local_300 = plVar4[1];
      *plVar4 = (long)plVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_308);
      if (local_308 != &local_2f8) {
        operator_delete(local_308);
      }
      if (local_348 != &local_338) {
        operator_delete(local_348);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != paVar13) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      return __return_storage_ptr__;
    }
    local_80 = uVar19;
    pVVar6 = QueryCompiler::getView
                       ((local_268->_qc).
                        super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,uVar19)
    ;
    if (pVVar6->_origin == pVVar6->_destination) {
      local_260 = &local_250;
      std::__cxx11::string::_M_construct((ulong)&local_260,'\x06');
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_260);
      local_288 = &local_278;
      plVar10 = plVar4 + 2;
      if ((long *)*plVar4 == plVar10) {
        local_278 = *plVar10;
        lStack_270 = plVar4[3];
      }
      else {
        local_278 = *plVar10;
        local_288 = (long *)*plVar4;
      }
      local_280 = plVar4[1];
      *plVar4 = (long)plVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      lVar14 = local_80 * 0x20;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_288,
                                  (ulong)local_268->viewName[local_80]._M_dataplus._M_p);
      local_240 = &local_230;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_230 = *puVar8;
        lStack_228 = plVar4[3];
      }
      else {
        local_230 = *puVar8;
        local_240 = (ulong *)*plVar4;
      }
      local_238 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_240);
      local_2e8 = &local_2d8;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_2d8 = *puVar8;
        lStack_2d0 = plVar4[3];
      }
      else {
        local_2d8 = *puVar8;
        local_2e8 = (ulong *)*plVar4;
      }
      local_2e0 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_1a0 = &local_190;
      std::__cxx11::string::_M_construct((ulong)&local_1a0,'\x06');
      uVar19 = 0xf;
      if (local_2e8 != &local_2d8) {
        uVar19 = local_2d8;
      }
      if (uVar19 < (ulong)(local_198 + local_2e0)) {
        uVar19 = 0xf;
        if (local_1a0 != &local_190) {
          uVar19 = local_190;
        }
        if (uVar19 < (ulong)(local_198 + local_2e0)) goto LAB_0022baa8;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_2e8);
      }
      else {
LAB_0022baa8:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_1a0);
      }
      local_2a8 = &local_298;
      puVar8 = puVar3 + 2;
      if ((ulong *)*puVar3 == puVar8) {
        local_298 = *puVar8;
        lStack_290 = puVar3[3];
      }
      else {
        local_298 = *puVar8;
        local_2a8 = (ulong *)*puVar3;
      }
      local_2a0 = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)puVar8 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      local_2c8 = &local_2b8;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_2b8 = *puVar8;
        lStack_2b0 = plVar4[3];
      }
      else {
        local_2b8 = *puVar8;
        local_2c8 = (ulong *)*plVar4;
      }
      local_2c0 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      auVar25 = *(undefined1 (*) [16])(pVVar6->_fVars).super__Base_bitset<2UL>._M_w;
      auVar36._0_2_ = auVar25._0_2_ >> 1;
      auVar36._2_2_ = auVar25._2_2_ >> 1;
      auVar36._4_2_ = auVar25._4_2_ >> 1;
      auVar36._6_2_ = auVar25._6_2_ >> 1;
      auVar36._8_2_ = auVar25._8_2_ >> 1;
      auVar36._10_2_ = auVar25._10_2_ >> 1;
      auVar36._12_2_ = auVar25._12_2_ >> 1;
      auVar36._14_2_ = auVar25._14_2_ >> 1;
      auVar36 = auVar36 & _DAT_002b0050;
      uVar16 = CONCAT11(auVar25[1] - auVar36[1],auVar25[0] - auVar36[0]);
      uVar17 = CONCAT13(auVar25[3] - auVar36[3],CONCAT12(auVar25[2] - auVar36[2],uVar16));
      uVar18 = CONCAT15(auVar25[5] - auVar36[5],CONCAT14(auVar25[4] - auVar36[4],uVar17));
      uVar12 = CONCAT17(auVar25[7] - auVar36[7],CONCAT16(auVar25[6] - auVar36[6],uVar18));
      auVar20._0_10_ = CONCAT19(auVar25[9] - auVar36[9],CONCAT18(auVar25[8] - auVar36[8],uVar12));
      auVar20[10] = auVar25[10] - auVar36[10];
      auVar20[0xb] = auVar25[0xb] - auVar36[0xb];
      auVar22[0xc] = auVar25[0xc] - auVar36[0xc];
      auVar22._0_12_ = auVar20;
      auVar22[0xd] = auVar25[0xd] - auVar36[0xd];
      auVar24[0xe] = auVar25[0xe] - auVar36[0xe];
      auVar24._0_14_ = auVar22;
      auVar24[0xf] = auVar25[0xf] - auVar36[0xf];
      auVar36 = auVar24 & _DAT_002b0060;
      auVar25._0_2_ = uVar16 >> 2;
      auVar25._2_2_ = (ushort)((uint)uVar17 >> 0x12);
      auVar25._4_2_ = (ushort)((uint6)uVar18 >> 0x22);
      auVar25._6_2_ = (ushort)((ulong)uVar12 >> 0x32);
      auVar25._8_2_ = (ushort)((unkuint10)auVar20._0_10_ >> 0x42);
      auVar25._10_2_ = auVar20._10_2_ >> 2;
      auVar25._12_2_ = auVar22._12_2_ >> 2;
      auVar25._14_2_ = auVar24._14_2_ >> 2;
      auVar25 = auVar25 & _DAT_002b0060;
      cVar15 = auVar25[0] + auVar36[0];
      bVar27 = auVar25[1] + auVar36[1];
      uVar16 = CONCAT11(bVar27,cVar15);
      cVar28 = auVar25[2] + auVar36[2];
      bVar29 = auVar25[3] + auVar36[3];
      uVar17 = CONCAT13(bVar29,CONCAT12(cVar28,uVar16));
      cVar30 = auVar25[4] + auVar36[4];
      bVar31 = auVar25[5] + auVar36[5];
      uVar18 = CONCAT15(bVar31,CONCAT14(cVar30,uVar17));
      cVar32 = auVar25[6] + auVar36[6];
      bVar33 = auVar25[7] + auVar36[7];
      uVar12 = CONCAT17(bVar33,CONCAT16(cVar32,uVar18));
      cVar34 = auVar25[8] + auVar36[8];
      bVar35 = auVar25[9] + auVar36[9];
      auVar21._0_10_ = CONCAT19(bVar35,CONCAT18(cVar34,uVar12));
      auVar21[10] = auVar25[10] + auVar36[10];
      auVar21[0xb] = auVar25[0xb] + auVar36[0xb];
      auVar23[0xc] = auVar25[0xc] + auVar36[0xc];
      auVar23._0_12_ = auVar21;
      auVar23[0xd] = auVar25[0xd] + auVar36[0xd];
      auVar26[0xe] = auVar25[0xe] + auVar36[0xe];
      auVar26._0_14_ = auVar23;
      auVar26[0xf] = auVar25[0xf] + auVar36[0xf];
      auVar37[0] = (char)(uVar16 >> 4) + cVar15;
      auVar37[1] = (bVar27 >> 4) + bVar27;
      auVar37[2] = (char)(ushort)((uint)uVar17 >> 0x14) + cVar28;
      auVar37[3] = (bVar29 >> 4) + bVar29;
      auVar37[4] = (char)(ushort)((uint6)uVar18 >> 0x24) + cVar30;
      auVar37[5] = (bVar31 >> 4) + bVar31;
      auVar37[6] = (char)(ushort)((ulong)uVar12 >> 0x34) + cVar32;
      auVar37[7] = (bVar33 >> 4) + bVar33;
      auVar37[8] = (char)(ushort)((unkuint10)auVar21._0_10_ >> 0x44) + cVar34;
      auVar37[9] = (bVar35 >> 4) + bVar35;
      auVar37[10] = (char)(auVar21._10_2_ >> 4) + auVar21[10];
      auVar37[0xb] = (auVar21[0xb] >> 4) + auVar21[0xb];
      auVar37[0xc] = (char)(auVar23._12_2_ >> 4) + auVar23[0xc];
      auVar37[0xd] = (auVar23[0xd] >> 4) + auVar23[0xd];
      auVar37[0xe] = (char)(auVar26._14_2_ >> 4) + auVar26[0xe];
      auVar37[0xf] = (auVar26[0xf] >> 4) + auVar26[0xf];
      auVar25 = psadbw(auVar37 & _DAT_002b0070,_DAT_002a4010);
      uVar19 = auVar25._8_8_ + auVar25._0_8_;
      cVar15 = '\x01';
      if (9 < uVar19) {
        uVar11 = uVar19;
        cVar28 = '\x04';
        do {
          cVar15 = cVar28;
          if (uVar11 < 100) {
            cVar15 = cVar15 + -2;
            goto LAB_0022bc4e;
          }
          if (uVar11 < 1000) {
            cVar15 = cVar15 + -1;
            goto LAB_0022bc4e;
          }
          if (uVar11 < 10000) goto LAB_0022bc4e;
          bVar2 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          cVar28 = cVar15 + '\x04';
        } while (bVar2);
        cVar15 = cVar15 + '\x01';
      }
LAB_0022bc4e:
      local_1c0 = &local_1b0;
      local_58 = lVar14;
      std::__cxx11::string::_M_construct((ulong)&local_1c0,cVar15);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1c0,(uint)local_1b8,uVar19);
      uVar19 = 0xf;
      if (local_2c8 != &local_2b8) {
        uVar19 = local_2b8;
      }
      if (uVar19 < (ulong)(local_1b8 + local_2c0)) {
        uVar19 = 0xf;
        if (local_1c0 != &local_1b0) {
          uVar19 = local_1b0;
        }
        if (uVar19 < (ulong)(local_1b8 + local_2c0)) goto LAB_0022bcea;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,(ulong)local_2c8);
      }
      else {
LAB_0022bcea:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_1c0);
      }
      puVar8 = puVar3 + 2;
      if ((ulong *)*puVar3 == puVar8) {
        local_358 = *puVar8;
        lStack_350 = puVar3[3];
        local_368 = &local_358;
      }
      else {
        local_358 = *puVar8;
        local_368 = (ulong *)*puVar3;
      }
      local_360 = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)puVar8 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_368);
      puVar8 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_328.field_2._M_allocated_capacity = *puVar8;
        local_328.field_2._8_8_ = plVar4[3];
        local_328._M_dataplus._M_p = (pointer)paVar13;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar8;
        local_328._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_328._M_string_length = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      uVar19 = (long)(pVVar6->_aggregates).
                     super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pVVar6->_aggregates).
                     super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      cVar15 = '\x01';
      if (9 < uVar19) {
        uVar11 = uVar19;
        cVar28 = '\x04';
        do {
          cVar15 = cVar28;
          if (uVar11 < 100) {
            cVar15 = cVar15 + -2;
            goto LAB_0022be0a;
          }
          if (uVar11 < 1000) {
            cVar15 = cVar15 + -1;
            goto LAB_0022be0a;
          }
          if (uVar11 < 10000) goto LAB_0022be0a;
          bVar2 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          cVar28 = cVar15 + '\x04';
        } while (bVar2);
        cVar15 = cVar15 + '\x01';
      }
LAB_0022be0a:
      local_1e0 = &local_1d0;
      std::__cxx11::string::_M_construct((ulong)&local_1e0,cVar15);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1e0,(uint)local_1d8,uVar19);
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != paVar13) {
        uVar12 = local_328.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_1d8 + local_328._M_string_length) {
        uVar19 = 0xf;
        if (local_1e0 != &local_1d0) {
          uVar19 = local_1d0;
        }
        if (uVar19 < local_1d8 + local_328._M_string_length) goto LAB_0022be98;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1e0,0,(char *)0x0,(ulong)local_328._M_dataplus._M_p);
      }
      else {
LAB_0022be98:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_1e0);
      }
      puVar8 = puVar3 + 2;
      if ((ulong *)*puVar3 == puVar8) {
        local_338 = *puVar8;
        uStack_330 = puVar3[3];
        local_348 = &local_338;
      }
      else {
        local_338 = *puVar8;
        local_348 = (ulong *)*puVar3;
      }
      local_340 = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)puVar8 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_348);
      local_308 = &local_2f8;
      plVar10 = plVar4 + 2;
      if ((long *)*plVar4 == plVar10) {
        local_2f8 = *plVar10;
        lStack_2f0 = plVar4[3];
      }
      else {
        local_2f8 = *plVar10;
        local_308 = (long *)*plVar4;
      }
      local_300 = plVar4[1];
      *plVar4 = (long)plVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_308);
      if (local_308 != &local_2f8) {
        operator_delete(local_308);
      }
      if (local_348 != &local_338) {
        operator_delete(local_348);
      }
      if (local_1e0 != &local_1d0) {
        operator_delete(local_1e0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != paVar13) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      if (local_368 != &local_358) {
        operator_delete(local_368);
      }
      if (local_1c0 != &local_1b0) {
        operator_delete(local_1c0);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8);
      }
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8);
      }
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0);
      }
      if (local_2e8 != &local_2d8) {
        operator_delete(local_2e8);
      }
      if (local_240 != &local_230) {
        operator_delete(local_240);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260);
      }
      local_308 = &local_2f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"");
      uVar19 = 0;
      do {
        if (((pVVar6->_fVars).super__Base_bitset<2UL>._M_w[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0
           ) {
          pAVar7 = TreeDecomposition::getAttribute
                             ((local_268->_td).
                              super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,uVar19);
          std::operator+(&local_328," << tuple.",&pAVar7->_name);
          puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_328);
          puVar8 = puVar3 + 2;
          if ((ulong *)*puVar3 == puVar8) {
            local_338 = *puVar8;
            uStack_330 = puVar3[3];
            local_348 = &local_338;
          }
          else {
            local_338 = *puVar8;
            local_348 = (ulong *)*puVar3;
          }
          local_340 = puVar3[1];
          *puVar3 = puVar8;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_348);
          if (local_348 != &local_338) {
            operator_delete(local_348);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != paVar13) {
            operator_delete(local_328._M_dataplus._M_p);
          }
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != 100);
      if ((pVVar6->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (pVVar6->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar19 = 0;
        do {
          cVar15 = '\x01';
          if (9 < uVar19) {
            uVar11 = uVar19;
            cVar28 = '\x04';
            do {
              cVar15 = cVar28;
              if (uVar11 < 100) {
                cVar15 = cVar15 + -2;
                goto LAB_0022c1f5;
              }
              if (uVar11 < 1000) {
                cVar15 = cVar15 + -1;
                goto LAB_0022c1f5;
              }
              if (uVar11 < 10000) goto LAB_0022c1f5;
              bVar2 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              cVar28 = cVar15 + '\x04';
            } while (bVar2);
            cVar15 = cVar15 + '\x01';
          }
LAB_0022c1f5:
          local_368 = &local_358;
          std::__cxx11::string::_M_construct((ulong)&local_368,cVar15);
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_368,(uint)local_360,uVar19)
          ;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,0x2b4933);
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          puVar8 = puVar3 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar8) {
            local_328.field_2._M_allocated_capacity = *puVar8;
            local_328.field_2._8_8_ = puVar3[3];
          }
          else {
            local_328.field_2._M_allocated_capacity = *puVar8;
            local_328._M_dataplus._M_p = (pointer)*puVar3;
          }
          local_328._M_string_length = puVar3[1];
          *puVar3 = puVar8;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 2) = 0;
          puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_328);
          puVar8 = puVar3 + 2;
          if ((ulong *)*puVar3 == puVar8) {
            local_338 = *puVar8;
            uStack_330 = puVar3[3];
            local_348 = &local_338;
          }
          else {
            local_338 = *puVar8;
            local_348 = (ulong *)*puVar3;
          }
          local_340 = puVar3[1];
          *puVar3 = puVar8;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_348);
          if (local_348 != &local_338) {
            operator_delete(local_348);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p);
          }
          if (local_368 != &local_358) {
            operator_delete(local_368);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 < (ulong)((long)(pVVar6->_aggregates).
                                        super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pVVar6->_aggregates).
                                        super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,'\x06');
      plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
      lVar14 = local_58;
      local_220 = &local_210;
      plVar10 = plVar4 + 2;
      if ((long *)*plVar4 == plVar10) {
        local_210 = *plVar10;
        lStack_208 = plVar4[3];
      }
      else {
        local_210 = *plVar10;
        local_220 = (long *)*plVar4;
      }
      local_218 = plVar4[1];
      *plVar4 = (long)plVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_220,
                                  *(ulong *)((long)&(local_268->viewName->_M_dataplus)._M_p +
                                            local_58));
      local_78 = &local_68;
      plVar10 = plVar4 + 2;
      if ((long *)*plVar4 == plVar10) {
        local_68 = *plVar10;
        lStack_60 = plVar4[3];
      }
      else {
        local_68 = *plVar10;
        local_78 = (long *)*plVar4;
      }
      local_70 = plVar4[1];
      *plVar4 = (long)plVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
      local_160 = &local_150;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_150 = *puVar8;
        lStack_148 = plVar4[3];
      }
      else {
        local_150 = *puVar8;
        local_160 = (ulong *)*plVar4;
      }
      local_158 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_a0 = local_90;
      std::__cxx11::string::_M_construct((ulong)&local_a0,'\x06');
      uVar19 = 0xf;
      if (local_160 != &local_150) {
        uVar19 = local_150;
      }
      if (uVar19 < (ulong)(local_98 + local_158)) {
        uVar19 = 0xf;
        if (local_a0 != local_90) {
          uVar19 = local_90[0];
        }
        if (uVar19 < (ulong)(local_98 + local_158)) goto LAB_0022c568;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_160);
      }
      else {
LAB_0022c568:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_a0);
      }
      local_200 = &local_1f0;
      puVar1 = puVar3 + 2;
      if ((undefined8 *)*puVar3 == puVar1) {
        local_1f0 = *puVar1;
        uStack_1e8 = puVar3[3];
      }
      else {
        local_1f0 = *puVar1;
        local_200 = (undefined8 *)*puVar3;
      }
      local_1f8 = puVar3[1];
      *puVar3 = puVar1;
      puVar3[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_200);
      local_140 = &local_130;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_130 = *puVar8;
        lStack_128 = plVar4[3];
      }
      else {
        local_130 = *puVar8;
        local_140 = (ulong *)*plVar4;
      }
      local_138 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_c0 = local_b0;
      std::__cxx11::string::_M_construct((ulong)&local_c0,'\t');
      uVar19 = 0xf;
      if (local_140 != &local_130) {
        uVar19 = local_130;
      }
      if (uVar19 < (ulong)(local_b8 + local_138)) {
        uVar19 = 0xf;
        if (local_c0 != local_b0) {
          uVar19 = local_b0[0];
        }
        if (uVar19 < (ulong)(local_b8 + local_138)) goto LAB_0022c6da;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_140);
      }
      else {
LAB_0022c6da:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_c0);
      }
      local_180 = &local_170;
      puVar1 = puVar3 + 2;
      if ((undefined8 *)*puVar3 == puVar1) {
        local_170 = *puVar1;
        uStack_168 = puVar3[3];
      }
      else {
        local_170 = *puVar1;
        local_180 = (undefined8 *)*puVar3;
      }
      local_178 = puVar3[1];
      *puVar3 = puVar1;
      puVar3[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_180,
                                  *(ulong *)((long)&(local_268->viewName->_M_dataplus)._M_p + lVar14
                                            ));
      local_1e0 = &local_1d0;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_1d0 = *puVar8;
        lStack_1c8 = plVar4[3];
      }
      else {
        local_1d0 = *puVar8;
        local_1e0 = (ulong *)*plVar4;
      }
      local_1d8 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e0);
      local_1c0 = &local_1b0;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_1b0 = *puVar8;
        lStack_1a8 = plVar4[3];
      }
      else {
        local_1b0 = *puVar8;
        local_1c0 = (ulong *)*plVar4;
      }
      local_1b8 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1c0,
                                  *(ulong *)((long)&(local_268->viewName->_M_dataplus)._M_p + lVar14
                                            ));
      local_1a0 = &local_190;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_190 = *puVar8;
        lStack_188 = plVar4[3];
      }
      else {
        local_190 = *puVar8;
        local_1a0 = (ulong *)*plVar4;
      }
      local_198 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a0);
      local_260 = &local_250;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_250 = *puVar8;
        lStack_248 = plVar4[3];
      }
      else {
        local_250 = *puVar8;
        local_260 = (ulong *)*plVar4;
      }
      local_258 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_e0 = local_d0;
      std::__cxx11::string::_M_construct((ulong)&local_e0,'\t');
      uVar19 = 0xf;
      if (local_260 != &local_250) {
        uVar19 = local_250;
      }
      if (uVar19 < (ulong)(local_d8 + local_258)) {
        uVar19 = 0xf;
        if (local_e0 != local_d0) {
          uVar19 = local_d0[0];
        }
        if (uVar19 < (ulong)(local_d8 + local_258)) goto LAB_0022c9af;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_260);
      }
      else {
LAB_0022c9af:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_e0);
      }
      local_288 = &local_278;
      plVar4 = puVar3 + 2;
      if ((long *)*puVar3 == plVar4) {
        local_278 = *plVar4;
        lStack_270 = puVar3[3];
      }
      else {
        local_278 = *plVar4;
        local_288 = (long *)*puVar3;
      }
      local_280 = puVar3[1];
      *puVar3 = plVar4;
      puVar3[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_240 = &local_230;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_230 = *puVar8;
        lStack_228 = plVar4[3];
      }
      else {
        local_230 = *puVar8;
        local_240 = (ulong *)*plVar4;
      }
      local_238 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_308);
      local_2e8 = &local_2d8;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_2d8 = *puVar8;
        lStack_2d0 = plVar4[3];
      }
      else {
        local_2d8 = *puVar8;
        local_2e8 = (ulong *)*plVar4;
      }
      local_2e0 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2e8);
      local_2a8 = &local_298;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_298 = *puVar8;
        lStack_290 = plVar4[3];
      }
      else {
        local_298 = *puVar8;
        local_2a8 = (ulong *)*plVar4;
      }
      local_2a0 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_100 = local_f0;
      std::__cxx11::string::_M_construct((ulong)&local_100,'\x06');
      uVar19 = 0xf;
      if (local_2a8 != &local_298) {
        uVar19 = local_298;
      }
      if (uVar19 < (ulong)(local_f8 + local_2a0)) {
        uVar19 = 0xf;
        if (local_100 != local_f0) {
          uVar19 = local_f0[0];
        }
        if (uVar19 < (ulong)(local_f8 + local_2a0)) goto LAB_0022cbff;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_2a8);
      }
      else {
LAB_0022cbff:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_100);
      }
      local_2c8 = &local_2b8;
      puVar8 = puVar3 + 2;
      if ((ulong *)*puVar3 == puVar8) {
        local_2b8 = *puVar8;
        lStack_2b0 = puVar3[3];
      }
      else {
        local_2b8 = *puVar8;
        local_2c8 = (ulong *)*puVar3;
      }
      local_2c0 = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)puVar8 = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
      local_368 = &local_358;
      puVar8 = puVar3 + 2;
      if ((ulong *)*puVar3 == puVar8) {
        local_358 = *puVar8;
        lStack_350 = puVar3[3];
      }
      else {
        local_358 = *puVar8;
        local_368 = (ulong *)*puVar3;
      }
      local_360 = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      local_120 = local_110;
      std::__cxx11::string::_M_construct((ulong)&local_120,'\x06');
      uVar19 = 0xf;
      if (local_368 != &local_358) {
        uVar19 = local_358;
      }
      if (uVar19 < (ulong)(local_118 + local_360)) {
        uVar19 = 0xf;
        if (local_120 != local_110) {
          uVar19 = local_110[0];
        }
        if (uVar19 < (ulong)(local_118 + local_360)) goto LAB_0022cd56;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_368);
      }
      else {
LAB_0022cd56:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_368,(ulong)local_120);
      }
      psVar9 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_328.field_2._M_allocated_capacity = *psVar9;
        local_328.field_2._8_8_ = puVar3[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *psVar9;
        local_328._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_328._M_string_length = puVar3[1];
      *puVar3 = psVar9;
      puVar3[1] = 0;
      *(undefined1 *)psVar9 = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_328);
      puVar8 = puVar3 + 2;
      if ((ulong *)*puVar3 == puVar8) {
        local_338 = *puVar8;
        uStack_330 = puVar3[3];
        local_348 = &local_338;
      }
      else {
        local_338 = *puVar8;
        local_348 = (ulong *)*puVar3;
      }
      local_340 = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_348);
      if (local_348 != &local_338) {
        operator_delete(local_348);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      if (local_120 != local_110) {
        operator_delete(local_120);
      }
      if (local_368 != &local_358) {
        operator_delete(local_368);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8);
      }
      if (local_100 != local_f0) {
        operator_delete(local_100);
      }
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8);
      }
      if (local_2e8 != &local_2d8) {
        operator_delete(local_2e8);
      }
      if (local_240 != &local_230) {
        operator_delete(local_240);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288);
      }
      if (local_e0 != local_d0) {
        operator_delete(local_e0);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260);
      }
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0);
      }
      if (local_1c0 != &local_1b0) {
        operator_delete(local_1c0);
      }
      if (local_1e0 != &local_1d0) {
        operator_delete(local_1e0);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180);
      }
      if (local_c0 != local_b0) {
        operator_delete(local_c0);
      }
      if (local_140 != &local_130) {
        operator_delete(local_140);
      }
      if (local_200 != &local_1f0) {
        operator_delete(local_200);
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if (local_160 != &local_150) {
        operator_delete(local_160);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      if (local_220 != &local_210) {
        operator_delete(local_220);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (local_308 != &local_2f8) {
        operator_delete(local_308);
      }
    }
    uVar19 = local_80 + 1;
  } while( true );
}

Assistant:

std::string CppGenerator::genDumpFunction()
{
    std::string returnString = "#ifdef DUMP_OUTPUT\n"+
        offset(1)+"void dumpOutputViews()\n"+offset(1)+"{\n"+
        offset(2)+"std::ofstream ofs;\n";
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);

        if (view->_origin != view->_destination)
            continue;

        returnString += offset(2)+"ofs.open(\"output/"+
            viewName[viewID]+".tbl\");\n"+
            offset(2)+"ofs << \""+std::to_string(view->_fVars.count())+" "+
            std::to_string(view->_aggregates.size())+"\\n\";\n";
            
        std::string fields = "";
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (view->_fVars[var])
            {
                Attribute* attr = _td->getAttribute(var);
                fields += " << tuple."+attr->_name+" <<\"|\"";
            }
        }

        for (size_t agg = 0; agg < view->_aggregates.size(); ++agg)
            fields += " << tuple.aggregates["+std::to_string(agg)+"] << \"|\"";

        fields.pop_back();
        fields.pop_back();
        fields.pop_back();
        
        returnString += offset(2)+"for (size_t i=0; i < "+viewName[viewID]+
            ".size(); ++i)\n"+offset(2)+"{\n"+offset(3)+
            viewName[viewID]+"_tuple& tuple = "+viewName[viewID]+"[i];\n"+
            offset(3)+"ofs "+fields+"\"\\n\";\n"+offset(2)+"}\n"+
            offset(2)+"ofs.close();\n";
    }

    returnString += offset(1)+"}\n"+"#endif\n";
    return returnString;
}